

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

int loader_impl_handle_register
              (plugin_manager manager,loader_impl impl,char *path,loader_handle_impl handle_impl,
              void **handle_ptr)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  long *in_R8;
  char *duplicated_key;
  loader_handle_impl target_handle;
  loader_impl_handle_register_cb_iterator_type iterator;
  undefined8 in_stack_ffffffffffffffa0;
  void **in_stack_ffffffffffffffa8;
  loader_handle_impl in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char *path_00;
  loader_impl in_stack_ffffffffffffffc0;
  loader_impl impl_00;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  if (in_R8 == (long *)0x0) {
    impl_00 = *(loader_impl *)(in_RCX + 0x1020);
    plugin_manager_iterate(in_RDI,loader_impl_handle_register_cb_iterate,&stack0xffffffffffffffc0);
    iVar1 = context_append(*(undefined8 *)(in_RSI + 0x30),*(undefined8 *)(in_RCX + 0x1020));
    if (iVar1 == 0) {
      iVar2 = loader_impl_handle_init
                        (impl_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8,iVar2);
      return iVar2;
    }
  }
  else {
    if (*in_R8 == 0) {
      iVar2 = loader_impl_handle_init
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,iVar2);
      return iVar2;
    }
    path_00 = (char *)*in_R8;
    iVar1 = context_contains(*(undefined8 *)(in_RCX + 0x1020),*(undefined8 *)(path_00 + 0x1020),
                             &stack0xffffffffffffffb0);
    if ((iVar1 == 0) && (in_stack_ffffffffffffffb0 != (loader_handle_impl)0x0)) {
      log_write_impl_va("metacall",0x32d,"loader_impl_handle_register",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                        ,3,
                        "Duplicated symbol found named \'%s\' already defined in the handle scope by handle: %s"
                        ,in_stack_ffffffffffffffb0,in_RDX);
      return 1;
    }
    iVar1 = context_append(*(undefined8 *)(path_00 + 0x1020),*(undefined8 *)(in_RCX + 0x1020));
    if (iVar1 == 0) {
      vector_push_back(*(undefined8 *)(in_RCX + 0x1030),&stack0xffffffffffffffb8);
      iVar2 = loader_impl_handle_init
                        (in_stack_ffffffffffffffc0,path_00,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8,iVar2);
      return iVar2;
    }
  }
  return 1;
}

Assistant:

int loader_impl_handle_register(plugin_manager manager, loader_impl impl, const char *path, loader_handle_impl handle_impl, void **handle_ptr)
{
	/* If there's no handle input/output pointer passed as input parameter, then propagate the handle symbols to the loader context */
	if (handle_ptr == NULL)
	{
		/* This case handles the global scope (shared scope between all loaders, there is no out reference to a handle) */
		struct loader_impl_handle_register_cb_iterator_type iterator;

		iterator.handle_ctx = handle_impl->ctx;
		iterator.duplicated_key = NULL;

		/* This checks if there are duplicated keys between all loaders and the current handle context */
		plugin_manager_iterate(manager, &loader_impl_handle_register_cb_iterate, &iterator);

		if (iterator.duplicated_key != NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Duplicated symbol found named '%s' already defined in the global scope by handle: %s", iterator.duplicated_key, path);
			return 1;
		}
		else if (context_append(impl->ctx, handle_impl->ctx) == 0)
		{
			return loader_impl_handle_init(impl, path, handle_impl, handle_ptr, 0);
		}
	}
	else
	{
		/* Otherwise, if there's a handle pointer and it is different from NULL, it means we are passing a handle as input parameter, so propagate symbols to this handle */
		if (*handle_ptr != NULL)
		{
			loader_handle_impl target_handle = (loader_handle_impl)*handle_ptr;
			char *duplicated_key;

			if (context_contains(handle_impl->ctx, target_handle->ctx, &duplicated_key) == 0 && duplicated_key != NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Duplicated symbol found named '%s' already defined in the handle scope by handle: %s", duplicated_key, path);
				return 1;
			}
			else if (context_append(target_handle->ctx, handle_impl->ctx) == 0)
			{
				vector_push_back_var(handle_impl->populated_handles, target_handle);

				return loader_impl_handle_init(impl, path, handle_impl, NULL, 1);
			}
		}
		else
		{
			/* Otherwise, initialize the handle and do not propagate the symbols, keep it private to the handle instance */
			return loader_impl_handle_init(impl, path, handle_impl, handle_ptr, 1);
		}
	}

	return 1;
}